

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O0

void Ivy_NodeComputeVolumeTrav2_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Ivy_Obj_t *pIVar1;
  Vec_Ptr_t *vNodes_local;
  Ivy_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x8 >> 4 & 1) != 0) {
    pIVar1 = Ivy_ObjFanin0(pObj);
    Ivy_NodeComputeVolumeTrav2_rec(pIVar1,vNodes);
    pIVar1 = Ivy_ObjFanin1(pObj);
    Ivy_NodeComputeVolumeTrav2_rec(pIVar1,vNodes);
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Ivy_NodeComputeVolumeTrav2_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( !pObj->fMarkA )
        return;
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin0(pObj), vNodes );
    Ivy_NodeComputeVolumeTrav2_rec( Ivy_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}